

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_resample_filters.cpp
# Opt level: O3

float basisu::gaussian_filter(float t)

{
  float fVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  
  fVar4 = -t;
  if (-t <= t) {
    fVar4 = t;
  }
  fVar1 = 0.0;
  if (fVar4 < 1.25) {
    fVar1 = expf(fVar4 * -2.0 * fVar4);
    dVar2 = cos((double)(fVar4 / 1.25) * 3.141592653589793);
    dVar3 = cos((double)(fVar4 / 1.25) * 6.283185307179586);
    dVar2 = (dVar3 * 0.07684867084026337 + dVar2 * 0.49656063318252563 + 0.4265907108783722) *
            (double)fVar1 * 0.7978845608028654;
    fVar1 = 0.0;
    if (1.249999968422344e-05 <= ABS(dVar2)) {
      fVar1 = (float)dVar2;
    }
  }
  return fVar1;
}

Assistant:

static float gaussian_filter(float t) // with blackman window
	{
		if (t < 0)
			t = -t;
		if (t < GAUSSIAN_SUPPORT)
			return clean(exp(-2.0f * t * t) * sqrt(2.0f / M_PI) * blackman_exact_window(t / GAUSSIAN_SUPPORT));
		else
			return 0.0f;
	}